

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogDestination::SetLoggerImpl(LogDestination *this,Logger *logger)

{
  Logger *logger_local;
  LogDestination *this_local;
  
  if (this->logger_ != logger) {
    if (((this->logger_ != (Logger *)0x0) && ((LogDestination *)this->logger_ != this)) &&
       (this->logger_ != (Logger *)0x0)) {
      (*this->logger_->_vptr_Logger[1])();
    }
    this->logger_ = logger;
  }
  return;
}

Assistant:

void LogDestination::SetLoggerImpl(base::Logger* logger) {
  if (logger_ == logger) {
    // Prevent releasing currently held sink on reset
    return;
  }

  if (logger_ && logger_ != &fileobject_) {
    // Delete user-specified logger set via SetLogger().
    delete logger_;
  }
  logger_ = logger;
}